

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

int __thiscall TPZBlockDiagonal<long_double>::Clear(TPZBlockDiagonal<long_double> *this)

{
  long in_RDI;
  int64_t in_stack_00000018;
  TPZVec<long_double> *in_stack_00000020;
  
  TPZVec<long_double>::Resize(in_stack_00000020,in_stack_00000018);
  TPZVec<long>::Resize((TPZVec<long> *)in_stack_00000020,in_stack_00000018);
  TPZVec<int>::Resize((TPZVec<int> *)in_stack_00000020,in_stack_00000018);
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  return 1;
}

Assistant:

int TPZBlockDiagonal<TVar>::Clear()
{
	fStorage.Resize(0);
	fBlockPos.Resize(0);
	fBlockSize.Resize(0);
	this->fRow = 0;
	this->fCol = 0;
	this->fDecomposed = 0;
	return( 1 );
}